

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

void __thiscall
capnp::DynamicList::Builder::Builder(Builder *this,ListSchema schema,OrphanBuilder *orphan)

{
  ElementSize elementSize;
  Which elementType;
  StructSize elementSize_00;
  Schema in_stack_ffffffffffffffd8;
  ListSchema schema_local;
  
  schema_local.elementType.field_4 = schema.elementType.field_4;
  schema_local.elementType._0_8_ = schema.elementType._0_8_;
  (this->schema).elementType.baseType = schema_local.elementType.baseType;
  (this->schema).elementType.listDepth = schema_local.elementType.listDepth;
  (this->schema).elementType.isImplicitParam = schema_local.elementType.isImplicitParam;
  (this->schema).elementType.field_3 = schema_local.elementType.field_3;
  *(short *)&(this->schema).elementType.field_0x6 = schema_local.elementType._6_2_;
  (this->schema).elementType.field_4 = schema_local.elementType.field_4;
  elementType = LIST;
  if (((undefined1  [16])schema.elementType & (undefined1  [16])0xff0000) == (undefined1  [16])0x0)
  {
    elementType = schema.elementType.baseType;
  }
  if (elementType == STRUCT) {
    Type::asStruct(&schema_local.elementType);
    elementSize_00 =
         anon_unknown_71::structSizeFromSchema((StructSchema)in_stack_ffffffffffffffd8.raw);
    capnp::_::OrphanBuilder::asStructList(&this->builder,orphan,elementSize_00);
  }
  else {
    elementSize = anon_unknown_71::elementSizeFor(elementType);
    capnp::_::OrphanBuilder::asList(&this->builder,orphan,elementSize);
  }
  return;
}

Assistant:

DynamicList::Builder::Builder(ListSchema schema, _::OrphanBuilder& orphan)
    : schema(schema), builder(schema.whichElementType() == schema::Type::STRUCT
        ? orphan.asStructList(structSizeFromSchema(schema.getStructElementType()))
        : orphan.asList(elementSizeFor(schema.whichElementType()))) {}